

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall
flow::TargetCodeGenerator::changeStack(TargetCodeGenerator *this,size_t pops,Value *pushValue)

{
  Value *pushValue_local;
  size_t pops_local;
  TargetCodeGenerator *this_local;
  
  if (pops != 0) {
    pop(this,pops);
  }
  if (pushValue != (Value *)0x0) {
    push(this,pushValue);
  }
  return;
}

Assistant:

void TargetCodeGenerator::changeStack(size_t pops, const Value* pushValue) {
  if (pops)
    pop(pops);

  if (pushValue)
    push(pushValue);
}